

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

void aom_hadamard_lp_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 auVar1 [32];
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 0x100) {
    aom_hadamard_lp_8x8_dual_avx2(src_diff,src_stride,(int16_t *)((long)coeff + lVar2));
    src_diff = src_diff + src_stride * 8;
  }
  for (lVar2 = 0; (uint)lVar2 < 0x40; lVar2 = lVar2 + 0x10) {
    auVar1 = vpaddw_avx2(*(undefined1 (*) [32])(coeff + lVar2 + 0x40),
                         *(undefined1 (*) [32])(coeff + lVar2));
    auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(coeff + lVar2),
                         *(undefined1 (*) [32])(coeff + lVar2 + 0x40));
    auVar4 = vpaddw_avx2(*(undefined1 (*) [32])(coeff + lVar2 + 0xc0),
                         *(undefined1 (*) [32])(coeff + lVar2 + 0x80));
    auVar5 = vpsubw_avx2(*(undefined1 (*) [32])(coeff + lVar2 + 0x80),
                         *(undefined1 (*) [32])(coeff + lVar2 + 0xc0));
    auVar6 = vpsraw_avx2(auVar1,1);
    auVar3 = vpsraw_avx2(auVar3,1);
    auVar4 = vpsraw_avx2(auVar4,1);
    auVar5 = vpsraw_avx2(auVar5,1);
    auVar1 = vpaddw_avx2(auVar4,auVar6);
    *(undefined1 (*) [32])(coeff + lVar2) = auVar1;
    auVar1 = vpaddw_avx2(auVar5,auVar3);
    *(undefined1 (*) [32])(coeff + lVar2 + 0x40) = auVar1;
    auVar1 = vpsubw_avx2(auVar6,auVar4);
    *(undefined1 (*) [32])(coeff + lVar2 + 0x80) = auVar1;
    auVar1 = vpsubw_avx2(auVar3,auVar5);
    *(undefined1 (*) [32])(coeff + lVar2 + 0xc0) = auVar1;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 2; ++idx) {
    const int16_t *src_ptr = src_diff + idx * 8 * src_stride;
    aom_hadamard_lp_8x8_dual_avx2(src_ptr, src_stride,
                                  t_coeff + (idx * 64 * 2));
  }

  for (int idx = 0; idx < 64; idx += 16) {
    const __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    const __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 64));
    const __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 128));
    const __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 192));

    __m256i b0 = _mm256_add_epi16(coeff0, coeff1);
    __m256i b1 = _mm256_sub_epi16(coeff0, coeff1);
    __m256i b2 = _mm256_add_epi16(coeff2, coeff3);
    __m256i b3 = _mm256_sub_epi16(coeff2, coeff3);

    b0 = _mm256_srai_epi16(b0, 1);
    b1 = _mm256_srai_epi16(b1, 1);
    b2 = _mm256_srai_epi16(b2, 1);
    b3 = _mm256_srai_epi16(b3, 1);
    _mm256_storeu_si256((__m256i *)coeff, _mm256_add_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 64), _mm256_add_epi16(b1, b3));
    _mm256_storeu_si256((__m256i *)(coeff + 128), _mm256_sub_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 192), _mm256_sub_epi16(b1, b3));
    coeff += 16;
    t_coeff += 16;
  }
}